

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>,_3,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
           *dst,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
                *src)

{
  Index size_00;
  Scalar *array;
  long start;
  undefined8 local_38;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
  *src_local;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
  *dst_local;
  
  size_00 = EigenBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>_>
            ::size((EigenBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>_>
                    *)dst);
  array = SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
          ::coeffRef(dst,0);
  local_38 = first_aligned<double,long>(array,size_00);
  start = local_38 + ((size_00 - local_38) / 2) * 2;
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>,Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>>
            (src,dst,0,local_38);
  for (; local_38 < start; local_38 = local_38 + 2) {
    SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>const>>
    ::
    copyPacket<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>,1,0>
              ((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>
                *)dst,local_38,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                *)src);
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>,Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>>
            (src,dst,start,size_00);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }